

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

void __thiscall
unodb::detail::
basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>::dump
          (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
           *this,ostream *os,bool param_2)

{
  __extent_storage<18446744073709551615UL> in_RCX;
  span<const_std::byte,_18446744073709551615UL> key;
  value_view v;
  char local_29;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  key._M_ptr = (pointer)(ulong)this->key_size;
  key._M_extent._M_extent_value = in_RCX._M_extent_value;
  dump_key<std::span<std::byte_const,18446744073709551615ul>>
            ((detail *)os,(ostream *)this->data,key);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  v._M_ptr = (pointer)(ulong)this->value_size;
  v._M_extent._M_extent_value = in_RCX._M_extent_value;
  dump_val((detail *)os,(ostream *)(this->data + this->key_size),v);
  local_29 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_29,1);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool /*recursive*/) const {
    os << ", ";
    ::unodb::detail::dump_key(os, get_key_view());
    os << ", ";
    ::unodb::detail::dump_val(os, get_value_view());
    os << '\n';
  }